

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer_combination_iterator.h
# Opt level: O0

void __thiscall
Gudhi::coxeter_triangulation::Integer_combination_iterator::increment
          (Integer_combination_iterator *this)

{
  value_type vVar1;
  reference pvVar2;
  bool bVar3;
  uint local_20;
  uint local_1c;
  uint i;
  uint j2;
  uint s;
  uint j1;
  Integer_combination_iterator *this_local;
  
  j2 = 0;
  i = 0;
  while( true ) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->value_,(ulong)j2);
    bVar3 = false;
    if (*pvVar2 == 0) {
      bVar3 = j2 < this->k_;
    }
    local_1c = j2;
    if (!bVar3) break;
    j2 = j2 + 1;
  }
  while( true ) {
    local_1c = local_1c + 1;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->value_,(ulong)local_1c);
    vVar1 = *pvVar2;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->bounds_,(ulong)local_1c);
    if (vVar1 != *pvVar2) break;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->bounds_,(ulong)local_1c);
    if (*pvVar2 != 0) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->value_,(ulong)j2);
      i = *pvVar2 + i;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->value_,(ulong)j2);
      *pvVar2 = 0;
      j2 = local_1c;
    }
  }
  if (local_1c < this->k_) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->value_,(ulong)j2);
    i = (*pvVar2 - 1) + i;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->value_,(ulong)j2);
    *pvVar2 = 0;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->value_,(ulong)local_1c);
    *pvVar2 = *pvVar2 + 1;
    local_20 = 0;
    for (; pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&this->bounds_,(ulong)local_20), *pvVar2 <= i; i = i - *pvVar2) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->bounds_,(ulong)local_20);
      vVar1 = *pvVar2;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->value_,(ulong)local_20);
      *pvVar2 = vVar1;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->bounds_,(ulong)local_20);
      local_20 = local_20 + 1;
    }
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->value_,(ulong)local_20);
    *pvVar2 = i;
  }
  else {
    this->is_end_ = true;
  }
  return;
}

Assistant:

void increment() {
    uint j1 = 0;
    uint s = 0;
    while (value_[j1] == 0 && j1 < k_) j1++;
    uint j2 = j1 + 1;
    while (value_[j2] == bounds_[j2]) {
      if (bounds_[j2] != 0) {
        s += value_[j1];
        value_[j1] = 0;
        j1 = j2;
      }
      j2++;
    }
    if (j2 >= k_) {
      is_end_ = true;
      return;
    }
    s += value_[j1] - 1;
    value_[j1] = 0;
    value_[j2]++;
    uint i = 0;
    while (s >= bounds_[i]) {
      value_[i] = bounds_[i];
      s -= bounds_[i];
      i++;
    }
    value_[i++] = s;
  }